

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_contains_all_different_sizes(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  bitset_t *pbVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint64_t uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong auStack_80 [5];
  bitset_t *pbStack_58;
  bitset_t *pbStack_50;
  code *pcStack_48;
  bitset_t *pbStack_38;
  
  pbVar3 = bitset_create_with_capacity(10);
  pbVar4 = bitset_create_with_capacity(5);
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array | 2;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array | 0x10;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array | 0x40;
  }
  if ((pbVar4->arraysize != 0) || (_Var2 = bitset_grow(pbVar4,1), _Var2)) {
    *pbVar4->array = *pbVar4->array | 2;
  }
  if ((pbVar4->arraysize != 0) || (_Var2 = bitset_grow(pbVar4,1), _Var2)) {
    *pbVar4->array = *pbVar4->array | 0x10;
  }
  _Var2 = bitset_contains_all(pbVar3,pbVar4);
  if (_Var2) {
    _Var2 = bitset_contains_all(pbVar4,pbVar3);
    if (!_Var2) {
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    test_contains_all_different_sizes_cold_1();
  }
  test_contains_all_different_sizes_cold_2();
  pcStack_48 = (code *)0x102453;
  pbStack_38 = pbVar3;
  pbVar3 = bitset_create();
  uVar12 = 0;
  pcStack_48 = (code *)0x10245e;
  pbVar4 = bitset_create();
  do {
    uVar11 = uVar12 >> 6;
    if (uVar11 < pbVar3->arraysize) {
LAB_0010247f:
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar12 & 0x3f);
    }
    else {
      pcStack_48 = (code *)0x10247b;
      _Var2 = bitset_grow(pbVar3,uVar11 + 1);
      if (_Var2) goto LAB_0010247f;
    }
    if ((uVar12 & 1) == 0) {
      if (pbVar4->arraysize <= uVar11) {
        pcStack_48 = (code *)0x1024aa;
        _Var2 = bitset_grow(pbVar4,uVar11 + 1);
        if (!_Var2) goto LAB_001024c3;
      }
      pbVar4->array[uVar11] = pbVar4->array[uVar11] | 1L << ((byte)uVar12 & 0x3e);
    }
LAB_001024c3:
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_48 = (code *)0x1024da;
  _Var2 = bitset_contains_all(pbVar3,pbVar4);
  if (_Var2) {
    pcStack_48 = (code *)0x1024e9;
    _Var2 = bitset_contains_all(pbVar4,pbVar3);
    if (_Var2) goto LAB_00102554;
    if (pbVar4->arraysize < 0x10) {
      pcStack_48 = (code *)0x102501;
      _Var2 = bitset_grow(pbVar4,0x10);
      if (_Var2) goto LAB_00102505;
    }
    else {
LAB_00102505:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    pcStack_48 = (code *)0x102521;
    _Var2 = bitset_contains_all(pbVar3,pbVar4);
    if (!_Var2) {
      pcStack_48 = (code *)0x102530;
      _Var2 = bitset_contains_all(pbVar4,pbVar3);
      if (!_Var2) {
        pcStack_48 = (code *)0x10253c;
        bitset_free(pbVar3);
        bitset_free(pbVar4);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_48 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_48 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_48 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_48 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar11 = 0;
  pbStack_58 = pbVar3;
  pbStack_50 = pbVar4;
  pcStack_48 = (code *)uVar12;
  pbVar3 = bitset_create();
  do {
    uVar12 = uVar11 >> 6;
    if (uVar12 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar12] = pbVar3->array[uVar12] | 1L << ((byte)uVar11 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar12 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar11 = uVar12 >> 6;
    if (uVar11 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar12 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar11 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar3->arraysize;
  if (uVar12 != 0) {
    puVar1 = pbVar3->array;
    uVar10 = 0;
    uVar11 = 0;
    lVar7 = 0;
    do {
      uVar8 = (puVar1[uVar10] >> ((byte)uVar11 & 0x3f)) << ((byte)uVar11 & 0x3f);
      uVar11 = uVar11 & 0xffffffffffffffc0;
      uVar5 = 0;
      do {
        while (uVar8 == 0) {
          uVar10 = uVar10 + 1;
          if (uVar10 == uVar12) {
            lVar9 = lVar7;
            if (uVar5 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar11 = uVar11 + 0x40;
          uVar8 = puVar1[uVar10];
          if (2 < uVar5) goto LAB_0010265a;
        }
        uVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        auStack_80[uVar5 + 1] = uVar6 | uVar11;
        uVar5 = uVar5 + 1;
        uVar8 = uVar8 & uVar8 - 1;
      } while (uVar5 != 3);
      uVar5 = 3;
LAB_0010265a:
      lVar9 = lVar7 + uVar5;
      uVar11 = lVar7 * 2 + 800;
      uVar10 = 0;
      do {
        uVar6 = lVar7 + uVar10;
        if (99 < lVar7 + uVar10) {
          uVar6 = uVar11;
        }
        if (auStack_80[uVar10 + 1] != uVar6) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar10 = uVar10 + 1;
        uVar11 = uVar11 + 2;
      } while (uVar5 != uVar10);
      uVar11 = auStack_80[uVar5] + 1;
      uVar10 = uVar11 >> 6;
      lVar7 = lVar9;
    } while (uVar10 < uVar12);
LAB_001026ac:
    if (lVar9 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar12 = 0;
  pbVar3 = bitset_create();
  do {
    uVar11 = uVar12 >> 6;
    if ((uVar11 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar11 + 1), _Var2)) {
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar12 & 0x3f);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar11 = uVar12 >> 6;
    if ((uVar11 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar11 + 1), _Var2)) {
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar12 & 0x3e);
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar3->arraysize;
  if (uVar12 != 0) {
    uVar5 = 0;
    uVar10 = 0;
    uVar11 = 0;
    do {
      uVar6 = pbVar3->array[uVar5] >> ((byte)uVar11 & 0x3f);
      if (uVar6 == 0) {
        lVar7 = uVar5 * -0x40;
        do {
          uVar5 = uVar5 + 1;
          if (uVar12 == uVar5) goto LAB_001027db;
          uVar11 = pbVar3->array[uVar5];
          lVar7 = lVar7 + -0x40;
        } while (uVar11 == 0);
        lVar9 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar11 = lVar9 - lVar7;
      }
      else {
        lVar7 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar11 = uVar11 + lVar7;
      }
      uVar5 = uVar10 * 2 + 800;
      if (uVar10 < 100) {
        uVar5 = uVar10;
      }
      if (uVar11 != uVar5) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar10 = uVar10 + 1;
      uVar11 = uVar11 + 1;
      uVar5 = uVar11 >> 6;
    } while (uVar5 < uVar12);
LAB_001027db:
    if (uVar10 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_contains_all_different_sizes() {
  const size_t superset_size = 10;
  const size_t subset_size = 5;

  bitset_t *superset = bitset_create_with_capacity(superset_size);
  bitset_t *subset = bitset_create_with_capacity(subset_size);

  bitset_set(superset, 1);
  bitset_set(superset, subset_size - 1);
  bitset_set(superset, subset_size + 1);

  bitset_set(subset, 1);
  bitset_set(subset, subset_size - 1);

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}